

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

void checksum_final(chksumwork_conflict *sumwrk,chksumval_conflict *sumval)

{
  sumalg sVar1;
  _func_int_archive_md5_ctx_ptr_void_ptr **pp_Var2;
  size_t sVar3;
  long lStack_20;
  
  sVar1 = sumwrk->alg;
  sVar3 = (size_t)sVar1;
  if (sVar3 != 0) {
    if (sVar1 == CKSUM_SHA1) {
      pp_Var2 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      sVar3 = 0x14;
      lStack_20 = 0x10;
    }
    else {
      if (sVar1 != CKSUM_MD5) goto LAB_00159288;
      pp_Var2 = &__archive_digest.md5final;
      sVar3 = 0x10;
      lStack_20 = 8;
    }
    (**pp_Var2)((archive_md5_ctx *)((long)&sumwrk->alg + lStack_20),sumval->val);
  }
  sumval->len = sVar3;
LAB_00159288:
  sumval->alg = sumwrk->alg;
  return;
}

Assistant:

static void
checksum_final(struct chksumwork *sumwrk, struct chksumval *sumval)
{

	switch (sumwrk->alg) {
	case CKSUM_NONE:
		sumval->len = 0;
		break;
	case CKSUM_SHA1:
		archive_sha1_final(&(sumwrk->sha1ctx), sumval->val);
		sumval->len = SHA1_SIZE;
		break;
	case CKSUM_MD5:
		archive_md5_final(&(sumwrk->md5ctx), sumval->val);
		sumval->len = MD5_SIZE;
		break;
	}
	sumval->alg = sumwrk->alg;
}